

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

UserInfo * __thiscall
kj::_::NullableValue<kj::Url::UserInfo>::emplace<kj::Url::UserInfo>
          (NullableValue<kj::Url::UserInfo> *this,UserInfo *params)

{
  if (this->isSet == true) {
    this->isSet = false;
    Url::UserInfo::~UserInfo(&(this->field_1).value);
  }
  Url::UserInfo::UserInfo(&(this->field_1).value,params);
  this->isSet = true;
  return (UserInfo *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }